

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_source_token_maybe_relative(Context_conflict2 *ctx,int relok)

{
  int iVar1;
  Token TVar2;
  uint uVar3;
  uint local_7c;
  int local_60;
  int component;
  int i;
  uint32 val;
  uint tokenlen;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char tokenbytes [5];
  uint32 swizzle;
  int invalid_swizzle;
  uint32 ui32;
  uint32 relative;
  int regnum;
  RegisterType regtype;
  Token token;
  int negate;
  SourceMod srcmod;
  uint32 *outtoken;
  int retval;
  int relok_local;
  Context_conflict2 *ctx_local;
  
  outtoken._0_4_ = 1;
  outtoken._4_4_ = relok;
  _retval = ctx;
  iVar1 = tokenbuf_overflow(ctx);
  if (iVar1 == 0) {
    iVar1 = _retval->tokenbufpos;
    _retval->tokenbufpos = iVar1 + 1;
    _negate = _retval->tokenbuf + iVar1;
    *_negate = 0;
    token = 0;
    regtype = REG_TYPE_TEMP;
    regnum = nexttoken(_retval);
    if (regnum == 0x21) {
      token = 0xd;
    }
    else if (regnum == 0x2d) {
      regtype = REG_TYPE_INPUT;
    }
    else if ((regnum == TOKEN_INT_LITERAL) && (iVar1 = check_token(_retval,"1"), iVar1 != 0)) {
      TVar2 = nexttoken(_retval);
      if (TVar2 == 0x2d) {
        token = 6;
      }
      else {
        fail(_retval,"Unexpected token");
      }
    }
    else {
      pushback(_retval);
    }
    parse_register_name(_retval,&relative,(int *)&ui32);
    if (_retval->tokenlen == 0) {
      if (regtype != REG_TYPE_TEMP) {
        set_source_mod(_retval,regtype,SRCMOD_NONE,SRCMOD_NEGATE,&token);
      }
    }
    else {
      if (_retval->tokenlen == 0) {
        __assert_fail("ctx->tokenlen > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_assembler.c"
                      ,0x2a0,"int parse_source_token_maybe_relative(Context *, const int)");
      }
      iVar1 = check_token_segment(_retval,"_bias");
      if (iVar1 == 0) {
        iVar1 = check_token_segment(_retval,"_bx2");
        if (iVar1 == 0) {
          iVar1 = check_token_segment(_retval,"_x2");
          if (iVar1 == 0) {
            iVar1 = check_token_segment(_retval,"_dz");
            if (iVar1 == 0) {
              iVar1 = check_token_segment(_retval,"_db");
              if (iVar1 == 0) {
                iVar1 = check_token_segment(_retval,"_dw");
                if (iVar1 == 0) {
                  iVar1 = check_token_segment(_retval,"_da");
                  if (iVar1 == 0) {
                    iVar1 = check_token_segment(_retval,"_abs");
                    if (iVar1 == 0) {
                      fail(_retval,"Invalid source modifier");
                    }
                    else {
                      set_source_mod(_retval,regtype,SRCMOD_ABS,SRCMOD_ABSNEGATE,&token);
                    }
                  }
                  else {
                    set_source_mod(_retval,regtype,SRCMOD_DW,SRCMOD_NONE,&token);
                  }
                }
                else {
                  set_source_mod(_retval,regtype,SRCMOD_DW,SRCMOD_NONE,&token);
                }
              }
              else {
                set_source_mod(_retval,regtype,SRCMOD_DZ,SRCMOD_NONE,&token);
              }
            }
            else {
              set_source_mod(_retval,regtype,SRCMOD_DZ,SRCMOD_NONE,&token);
            }
          }
          else {
            set_source_mod(_retval,regtype,SRCMOD_X2,SRCMOD_X2NEGATE,&token);
          }
        }
        else {
          set_source_mod(_retval,regtype,SRCMOD_SIGN,SRCMOD_SIGNNEGATE,&token);
        }
      }
      else {
        set_source_mod(_retval,regtype,SRCMOD_BIAS,SRCMOD_BIASNEGATE,&token);
      }
    }
    invalid_swizzle = 0;
    TVar2 = nexttoken(_retval);
    if (TVar2 == 0x5b) {
      if (outtoken._4_4_ == 0) {
        fail(_retval,"Relative addressing not permitted here.");
      }
      else {
        outtoken._0_4_ = (int)outtoken + 1;
      }
      parse_source_token_maybe_relative(_retval,0);
      invalid_swizzle = 1;
      TVar2 = nexttoken(_retval);
      if (TVar2 == 0x2b) {
        if (ui32 != 0) {
          fail(_retval,"Relative addressing with explicit register number.");
        }
        swizzle = 0;
        TVar2 = nexttoken(_retval);
        if (((TVar2 != TOKEN_INT_LITERAL) || (iVar1 = ui32fromtoken(_retval,&swizzle), iVar1 == 0))
           || (_retval->tokenlen != 0)) {
          fail(_retval,"Invalid relative addressing offset");
        }
        ui32 = swizzle + ui32;
      }
      else {
        pushback(_retval);
      }
      TVar2 = nexttoken(_retval);
      if (TVar2 != 0x5d) {
        fail(_retval,"Expected \']\'");
      }
    }
    else {
      pushback(_retval);
    }
    tokenbytes[1] = '\0';
    tokenbytes[2] = '\0';
    tokenbytes[3] = '\0';
    tokenbytes[4] = '\0';
    cStack_4c = '\0';
    cStack_4b = '\0';
    cStack_4a = '\0';
    tokenbytes[0] = '\0';
    TVar2 = nexttoken(_retval);
    if (TVar2 == 0x2e) {
      iVar1 = scalar_register(_retval->shader_type,relative,ui32);
      if (iVar1 == 0) {
        TVar2 = nexttoken(_retval);
        if (TVar2 == TOKEN_IDENTIFIER) {
          memset((void *)((long)&val + 3),0,5);
          uVar3 = _retval->tokenlen;
          local_7c = uVar3;
          if (3 < uVar3) {
            local_7c = 4;
          }
          memcpy((void *)((long)&val + 3),_retval->token,(ulong)local_7c);
          if (uVar3 == 1) {
            tokenlen._2_1_ = val._3_1_;
            tokenlen._1_1_ = val._3_1_;
            tokenlen._0_1_ = val._3_1_;
          }
          else if (uVar3 == 2) {
            tokenlen._2_1_ = (undefined1)tokenlen;
            tokenlen._1_1_ = (undefined1)tokenlen;
          }
          else if (uVar3 == 3) {
            tokenlen._2_1_ = tokenlen._1_1_;
          }
          else if (uVar3 != 4) {
            tokenbytes[1] = '\x01';
            tokenbytes[2] = '\0';
            tokenbytes[3] = '\0';
            tokenbytes[4] = '\0';
          }
          tokenlen._3_1_ = 0;
          component = 0;
          for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
            switch(*(undefined1 *)((long)&val + (long)local_60 + 3)) {
            case 0x61:
            case 0x77:
              component = 3;
              break;
            case 0x62:
            case 0x7a:
              component = 2;
              break;
            default:
              tokenbytes[1] = '\x01';
              tokenbytes[2] = '\0';
              tokenbytes[3] = '\0';
              tokenbytes[4] = '\0';
              break;
            case 0x67:
            case 0x79:
              component = 1;
              break;
            case 0x72:
            case 0x78:
              component = 0;
            }
            uVar3 = component << ((byte)(local_60 << 1) & 0x1f) | _cStack_4c;
            cStack_4c = (char)uVar3;
            cStack_4b = (char)(uVar3 >> 8);
            cStack_4a = (char)(uVar3 >> 0x10);
            tokenbytes[0] = (char)(uVar3 >> 0x18);
          }
        }
        else {
          tokenbytes[1] = '\x01';
          tokenbytes[2] = '\0';
          tokenbytes[3] = '\0';
          tokenbytes[4] = '\0';
        }
      }
      else {
        fail(_retval,"Swizzle specified for scalar register");
      }
    }
    else {
      cStack_4c = -0x1c;
      cStack_4b = '\0';
      cStack_4a = '\0';
      tokenbytes[0] = '\0';
      pushback(_retval);
    }
    if (tokenbytes._1_4_ != 0) {
      fail(_retval,"Invalid swizzle");
    }
    *_negate = ui32 & 0x7ff | 0x80000000 | (invalid_swizzle & 1U) << 0xd |
               (_cStack_4c & 0xff) << 0x10 | (token & 0xf) << 0x18 | (relative & 7) << 0x1c |
               (relative & 0x18) << 8;
    ctx_local._4_4_ = (int)outtoken;
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int parse_source_token_maybe_relative(Context *ctx, const int relok)
{
    int retval = 1;

    if (tokenbuf_overflow(ctx))
        return 0;

    // mark this now, so optional relative addressing token is placed second.
    uint32 *outtoken = &ctx->tokenbuf[ctx->tokenbufpos++];
    *outtoken = 0;

    SourceMod srcmod = SRCMOD_NONE;
    int negate = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '!'))
        srcmod = SRCMOD_NOT;
    else if (token == ((Token) '-'))
        negate = 1;
    else if ( (token == TOKEN_INT_LITERAL) && (check_token(ctx, "1")) )
    {
        if (nexttoken(ctx) != ((Token) '-'))
            fail(ctx, "Unexpected token");
        else
            srcmod = SRCMOD_COMPLEMENT;
    } // else
    else
    {
        pushback(ctx);
    } // else

    RegisterType regtype;
    int regnum;
    parse_register_name(ctx, &regtype, &regnum);

    if (ctx->tokenlen == 0)
    {
        if (negate)
            set_source_mod(ctx, negate, SRCMOD_NONE, SRCMOD_NEGATE, &srcmod);
    } // if
    else
    {
        assert(ctx->tokenlen > 0);
        if (check_token_segment(ctx, "_bias"))
            set_source_mod(ctx, negate, SRCMOD_BIAS, SRCMOD_BIASNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_bx2"))
            set_source_mod(ctx, negate, SRCMOD_SIGN, SRCMOD_SIGNNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_x2"))
            set_source_mod(ctx, negate, SRCMOD_X2, SRCMOD_X2NEGATE, &srcmod);
        else if (check_token_segment(ctx, "_dz"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_db"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_dw"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_da"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_abs"))
            set_source_mod(ctx, negate, SRCMOD_ABS, SRCMOD_ABSNEGATE, &srcmod);
        else
            fail(ctx, "Invalid source modifier");
    } // else

    uint32 relative = 0;
    if (nexttoken(ctx) != ((Token) '['))
        pushback(ctx);  // not relative addressing?
    else
    {
        if (!relok)
            fail(ctx, "Relative addressing not permitted here.");
        else
            retval++;

        parse_source_token_maybe_relative(ctx, 0);
        relative = 1;

        if (nexttoken(ctx) != ((Token) '+'))
            pushback(ctx);
        else
        {
            // !!! FIXME: maybe c3[a0.x + 5] is legal and becomes c[a0.x + 8] ?
            if (regnum != 0)
                fail(ctx, "Relative addressing with explicit register number.");

            uint32 ui32 = 0;
            if ( (nexttoken(ctx) != TOKEN_INT_LITERAL) ||
                 (!ui32fromtoken(ctx, &ui32)) ||
                 (ctx->tokenlen != 0) )
            {
                fail(ctx, "Invalid relative addressing offset");
            } // if
            regnum += (int) ui32;
        } // else

        if (nexttoken(ctx) != ((Token) ']'))
            fail(ctx, "Expected ']'");
    } // else

    int invalid_swizzle = 0;
    uint32 swizzle = 0;
    if (nexttoken(ctx) != ((Token) '.'))
    {
        swizzle = 0xE4;  // 0xE4 == 11100100 ... 0 1 2 3. No swizzle.
        pushback(ctx);  // no explicit writemask; do full mask.
    } // if
    else if (scalar_register(ctx->shader_type, regtype, regnum))
        fail(ctx, "Swizzle specified for scalar register");
    else if (nexttoken(ctx) != TOKEN_IDENTIFIER)
        invalid_swizzle = 1;
    else
    {
        char tokenbytes[5] = { '\0', '\0', '\0', '\0', '\0' };
        const unsigned int tokenlen = ctx->tokenlen;
        memcpy(tokenbytes, ctx->token, ((tokenlen < 4) ? tokenlen : 4));

        // deal with shortened form (.x = .xxxx, etc).
        if (tokenlen == 1)
            tokenbytes[1] = tokenbytes[2] = tokenbytes[3] = tokenbytes[0];
        else if (tokenlen == 2)
            tokenbytes[2] = tokenbytes[3] = tokenbytes[1];
        else if (tokenlen == 3)
            tokenbytes[3] = tokenbytes[2];
        else if (tokenlen != 4)
            invalid_swizzle = 1;
        tokenbytes[4] = '\0';

        uint32 val = 0;
        int i;
        for (i = 0; i < 4; i++)
        {
            const int component = (int) tokenbytes[i];
            switch (component)
            {
                case 'r': case 'x': val = 0; break;
                case 'g': case 'y': val = 1; break;
                case 'b': case 'z': val = 2; break;
                case 'a': case 'w': val = 3; break;
                default: invalid_swizzle = 1; break;
            } // switch
            swizzle |= (val << (i * 2));
        } // for
    } // else

    if (invalid_swizzle)
        fail(ctx, "Invalid swizzle");

    *outtoken = ( ((((uint32) 1)) << 31) |
                  ((((uint32) regnum) & 0x7ff) << 0) |
                  ((((uint32) relative) & 0x1) << 13) |
                  ((((uint32) swizzle) & 0xFF) << 16) |
                  ((((uint32) srcmod) & 0xF) << 24) |
                  ((((uint32) regtype) & 0x7) << 28) |
                  ((((uint32) regtype) & 0x18) << 8) );

    return retval;
}